

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void __thiscall game::updateDisplay(game *this,Game game)

{
  ostream *poVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  Game game_local;
  
  game_local.bord._0_8_ = game.bord._0_8_;
  _j = this;
  system("clear");
  poVar1 = std::operator<<((ostream *)&std::cout,"0  1  2 ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               *(char *)((long)&j + (long)local_20 + (long)local_1c * 3));
      std::operator<<(poVar1,"|  ");
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"----------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void updateDisplay(const Game game) {
        system("clear");
        std::cout << "0  1  2 " << std::endl;
        std::cout << "----------" << std::endl;
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                std::cout << game.bord[i][j] << "|  ";
            }
            std::cout << i << std::endl << "----------" << std::endl;
        }
    }